

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O1

int quicly_local_cid_retire(quicly_local_cid_set_t *set,uint64_t sequence,int *_has_pending)

{
  en_quicly_local_cid_state_t eVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint64_t uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  en_quicly_local_cid_state_t eVar17;
  undefined4 uVar18;
  int iVar19;
  quicly_local_cid_t *pqVar20;
  size_t sVar21;
  ulong uVar22;
  quicly_local_cid_t *pqVar23;
  uint64_t *puVar24;
  size_t sVar25;
  size_t sVar26;
  bool bVar27;
  bool bVar28;
  quicly_local_cid_t tmp;
  
  sVar21 = set->_size;
  sVar26 = sVar21;
  if (sVar21 == 0) {
    bVar28 = false;
  }
  else {
    puVar24 = &set->cids[0].sequence;
    bVar28 = true;
    sVar25 = 0;
    do {
      if (((quicly_local_cid_t *)(puVar24 + -1))->state != QUICLY_LOCAL_CID_STATE_IDLE) {
        if (*puVar24 == sequence) {
          bVar27 = sVar26 != sVar21;
          sVar26 = sVar25;
          if (bVar27) {
            __assert_fail("retired_at == set->_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                          ,0xbf,
                          "int quicly_local_cid_retire(quicly_local_cid_set_t *, uint64_t, int *)");
          }
        }
        else {
          bVar28 = false;
        }
      }
      sVar25 = sVar25 + 1;
      puVar24 = puVar24 + 7;
    } while (sVar21 != sVar25);
    bVar28 = !bVar28;
  }
  if (sVar26 == sVar21) {
    eVar1 = set->cids[0].state;
  }
  else {
    if (!bVar28) {
      return 0x2000a;
    }
    set->cids[sVar26].state = QUICLY_LOCAL_CID_STATE_IDLE;
    set->cids[sVar26].sequence = 0xffffffffffffffff;
    if (sVar26 + 1 < set->_size) {
      pqVar20 = set->cids + sVar26 + 1;
      sVar21 = sVar26;
      do {
        sVar26 = sVar21;
        if (pqVar20->state != QUICLY_LOCAL_CID_STATE_PENDING) break;
        uVar2 = *(undefined8 *)(pqVar20 + -1);
        uVar3 = *(undefined8 *)((long)(pqVar20 + -1) + 8);
        uVar4 = *(undefined8 *)((long)(pqVar20 + -1) + 0x10);
        uVar5 = *(undefined8 *)((long)(pqVar20 + -1) + 0x18);
        uVar6 = *(undefined8 *)((long)(pqVar20 + -1) + 0x20);
        uVar7 = *(undefined8 *)((long)(pqVar20 + -1) + 0x28);
        uVar8 = *(undefined8 *)((long)(pqVar20 + -1) + 0x30);
        uVar9 = *(undefined8 *)pqVar20;
        uVar10 = pqVar20->sequence;
        uVar11 = *(undefined8 *)(pqVar20->cid).cid;
        uVar12 = *(undefined8 *)((pqVar20->cid).cid + 8);
        uVar13 = *(undefined8 *)((pqVar20->cid).cid + 0x10);
        uVar14 = *(undefined8 *)(pqVar20->stateless_reset_token + 3);
        uVar15 = *(undefined8 *)(pqVar20->stateless_reset_token + 0xb);
        *(undefined8 *)((long)(pqVar20 + -1) + 0x18) = *(undefined8 *)((pqVar20->cid).cid + 8);
        *(undefined8 *)((long)(pqVar20 + -1) + 0x20) = uVar13;
        *(undefined8 *)((long)(pqVar20 + -1) + 0x28) = uVar14;
        *(undefined8 *)((long)(pqVar20 + -1) + 0x30) = uVar15;
        *(undefined8 *)(pqVar20 + -1) = uVar9;
        *(uint64_t *)((long)(pqVar20 + -1) + 8) = uVar10;
        *(undefined8 *)((long)(pqVar20 + -1) + 0x10) = uVar11;
        *(undefined8 *)((long)(pqVar20 + -1) + 0x18) = uVar12;
        *(undefined8 *)pqVar20 = uVar2;
        pqVar20->sequence = uVar3;
        *(undefined8 *)(pqVar20->cid).cid = uVar4;
        *(undefined8 *)((pqVar20->cid).cid + 8) = uVar5;
        *(undefined8 *)((pqVar20->cid).cid + 8) = uVar5;
        *(undefined8 *)((pqVar20->cid).cid + 0x10) = uVar6;
        *(undefined8 *)(pqVar20->stateless_reset_token + 3) = uVar7;
        *(undefined8 *)(pqVar20->stateless_reset_token + 0xb) = uVar8;
        sVar26 = sVar21 + 1;
        pqVar20 = pqVar20 + 1;
        uVar22 = sVar21 + 2;
        sVar21 = sVar26;
      } while (uVar22 < set->_size);
    }
    pqVar20 = set->cids;
    iVar19 = generate_cid(set,sVar26);
    if (iVar19 != 0) {
      pqVar20[sVar26].state = QUICLY_LOCAL_CID_STATE_PENDING;
      bVar28 = true;
      if (sVar26 != 0) {
        pqVar23 = pqVar20 + sVar26;
        do {
          if (pqVar20->state != QUICLY_LOCAL_CID_STATE_PENDING) {
            eVar17 = pqVar20->state;
            uVar18 = *(undefined4 *)&pqVar20->field_0x4;
            uVar3 = pqVar20->sequence;
            uVar2 = *(undefined8 *)(pqVar20->cid).cid;
            uVar4 = *(undefined8 *)((pqVar20->cid).cid + 8);
            uVar5 = *(undefined8 *)((pqVar20->cid).cid + 0x10);
            uVar6 = *(undefined8 *)(pqVar20->stateless_reset_token + 3);
            uVar7 = *(undefined8 *)(pqVar20->stateless_reset_token + 0xb);
            eVar1 = pqVar23->state;
            uVar16 = *(undefined4 *)&pqVar23->field_0x4;
            uVar10 = pqVar23->sequence;
            uVar8 = *(undefined8 *)(pqVar23->cid).cid;
            uVar9 = *(undefined8 *)((pqVar23->cid).cid + 8);
            uVar11 = *(undefined8 *)((pqVar23->cid).cid + 0x10);
            uVar12 = *(undefined8 *)(pqVar23->stateless_reset_token + 3);
            uVar13 = *(undefined8 *)(pqVar23->stateless_reset_token + 0xb);
            *(undefined8 *)((pqVar20->cid).cid + 8) = *(undefined8 *)((pqVar23->cid).cid + 8);
            *(undefined8 *)((pqVar20->cid).cid + 0x10) = uVar11;
            *(undefined8 *)(pqVar20->stateless_reset_token + 3) = uVar12;
            *(undefined8 *)(pqVar20->stateless_reset_token + 0xb) = uVar13;
            pqVar20->state = eVar1;
            *(undefined4 *)&pqVar20->field_0x4 = uVar16;
            pqVar20->sequence = uVar10;
            *(undefined8 *)(pqVar20->cid).cid = uVar8;
            *(undefined8 *)((pqVar20->cid).cid + 8) = uVar9;
            *(undefined8 *)((pqVar23->cid).cid + 8) = uVar4;
            *(undefined8 *)((pqVar23->cid).cid + 0x10) = uVar5;
            *(undefined8 *)(pqVar23->stateless_reset_token + 3) = uVar6;
            *(undefined8 *)(pqVar23->stateless_reset_token + 0xb) = uVar7;
            pqVar23->state = eVar17;
            *(undefined4 *)&pqVar23->field_0x4 = uVar18;
            pqVar23->sequence = uVar3;
            *(undefined8 *)(pqVar23->cid).cid = uVar2;
            *(undefined8 *)((pqVar23->cid).cid + 8) = uVar4;
            break;
          }
          pqVar20 = pqVar20 + 1;
          sVar26 = sVar26 - 1;
        } while (sVar26 != 0);
      }
      goto LAB_0011f377;
    }
    eVar1 = pqVar20->state;
  }
  bVar28 = eVar1 == QUICLY_LOCAL_CID_STATE_PENDING;
LAB_0011f377:
  *_has_pending = (uint)bVar28;
  return 0;
}

Assistant:

int quicly_local_cid_retire(quicly_local_cid_set_t *set, uint64_t sequence, int *_has_pending)
{
    /* find the CID to be retired, also check if there is at least one CID that has been issued */
    size_t retired_at = set->_size;
    int becomes_empty = 1;
    for (size_t i = 0; i < set->_size; i++) {
        if (set->cids[i].state == QUICLY_LOCAL_CID_STATE_IDLE)
            continue;
        if (set->cids[i].sequence == sequence) {
            assert(retired_at == set->_size);
            retired_at = i;
        } else {
            becomes_empty = 0;
        }
    }

    /* nothing to do if given CID has been retired already */
    if (retired_at == set->_size) {
        *_has_pending = has_pending(set);
        return 0;
    }

    /* it is a protocol violation for the remote peer to retire the only CID that is available to it */
    if (becomes_empty)
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    /* retire given CID */
    set->cids[retired_at].state = QUICLY_LOCAL_CID_STATE_IDLE;
    set->cids[retired_at].sequence = UINT64_MAX;

    /* move following PENDING CIDs to front */
    for (size_t i = retired_at + 1; i < set->_size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_PENDING)
            break;
        swap_cids(&set->cids[i], &set->cids[retired_at]);
        retired_at = i;
    }

    /* generate one new CID */
    if (generate_cid(set, retired_at)) {
        do_mark_pending(set, retired_at);
        *_has_pending = 1;
    } else {
        *_has_pending = has_pending(set);
    }

    return 0;
}